

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O1

bool __thiscall
draco::GeometryAttribute::ConvertValue<float>
          (GeometryAttribute *this,AttributeValueIndex att_id,int8_t out_num_components,
          float *out_val)

{
  bool bVar1;
  
  if (out_val != (float *)0x0) {
    switch(this->data_type_) {
    case DT_INT8:
      bVar1 = ConvertTypedValue<signed_char,float>(this,att_id,out_num_components,out_val);
      return bVar1;
    case DT_UINT8:
      bVar1 = ConvertTypedValue<unsigned_char,float>(this,att_id,out_num_components,out_val);
      return bVar1;
    case DT_INT16:
      bVar1 = ConvertTypedValue<short,float>(this,att_id,out_num_components,out_val);
      return bVar1;
    case DT_UINT16:
      bVar1 = ConvertTypedValue<unsigned_short,float>(this,att_id,out_num_components,out_val);
      return bVar1;
    case DT_INT32:
      bVar1 = ConvertTypedValue<int,float>(this,att_id,out_num_components,out_val);
      return bVar1;
    case DT_UINT32:
      bVar1 = ConvertTypedValue<unsigned_int,float>(this,att_id,out_num_components,out_val);
      return bVar1;
    case DT_INT64:
      bVar1 = ConvertTypedValue<long,float>(this,att_id,out_num_components,out_val);
      return bVar1;
    case DT_UINT64:
      bVar1 = ConvertTypedValue<unsigned_long,float>(this,att_id,out_num_components,out_val);
      return bVar1;
    case DT_FLOAT32:
      bVar1 = ConvertTypedValue<float,float>(this,att_id,out_num_components,out_val);
      return bVar1;
    case DT_FLOAT64:
      bVar1 = ConvertTypedValue<double,float>(this,att_id,out_num_components,out_val);
      return bVar1;
    case DT_BOOL:
      bVar1 = ConvertTypedValue<bool,float>(this,att_id,out_num_components,out_val);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ConvertValue(AttributeValueIndex att_id, int8_t out_num_components,
                    OutT *out_val) const {
    if (out_val == nullptr) {
      return false;
    }
    switch (data_type_) {
      case DT_INT8:
        return ConvertTypedValue<int8_t, OutT>(att_id, out_num_components,
                                               out_val);
      case DT_UINT8:
        return ConvertTypedValue<uint8_t, OutT>(att_id, out_num_components,
                                                out_val);
      case DT_INT16:
        return ConvertTypedValue<int16_t, OutT>(att_id, out_num_components,
                                                out_val);
      case DT_UINT16:
        return ConvertTypedValue<uint16_t, OutT>(att_id, out_num_components,
                                                 out_val);
      case DT_INT32:
        return ConvertTypedValue<int32_t, OutT>(att_id, out_num_components,
                                                out_val);
      case DT_UINT32:
        return ConvertTypedValue<uint32_t, OutT>(att_id, out_num_components,
                                                 out_val);
      case DT_INT64:
        return ConvertTypedValue<int64_t, OutT>(att_id, out_num_components,
                                                out_val);
      case DT_UINT64:
        return ConvertTypedValue<uint64_t, OutT>(att_id, out_num_components,
                                                 out_val);
      case DT_FLOAT32:
        return ConvertTypedValue<float, OutT>(att_id, out_num_components,
                                              out_val);
      case DT_FLOAT64:
        return ConvertTypedValue<double, OutT>(att_id, out_num_components,
                                               out_val);
      case DT_BOOL:
        return ConvertTypedValue<bool, OutT>(att_id, out_num_components,
                                             out_val);
      default:
        // Wrong attribute type.
        return false;
    }
  }